

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O3

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::KeyEvent,QWindow*,unsigned_long,QEvent::Type,int,QFlags<Qt::KeyboardModifier>,unsigned_int,unsigned_int,unsigned_int,QString,bool,unsigned_short>
               (QWindow *args,unsigned_long args_1,Type args_2,int args_3,
               QFlags<Qt::KeyboardModifier> args_4,uint args_5,uint args_6,uint args_7,
               QString args_8,bool args_9,unsigned_short args_10)

{
  QString args_8_00;
  char cVar1;
  undefined1 uVar2;
  int iVar3;
  QInputDevice *pQVar4;
  int *piVar5;
  long in_FS_OFFSET;
  QArrayData *local_f0;
  qsizetype local_e8;
  undefined8 local_e0;
  QString local_d8;
  undefined1 local_b8 [24];
  int *piStack_a0;
  QWindow *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QInputDevice *pQStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  QArrayData *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0xa1;
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    local_f0 = *(QArrayData **)&(args_8.d.d)->super_QArrayData;
    local_e8 = ((args_8.d.d)->super_QArrayData).alloc;
    local_e0._0_4_ = args_8.d.d[1].super_QArrayData.ref_;
    local_e0._4_4_ = args_8.d.d[1].super_QArrayData.flags;
    if (local_f0 != (QArrayData *)0x0) {
      LOCK();
      (local_f0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_f0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    args_8_00.d.ptr._0_1_ = args_8.d.ptr._0_1_;
    args_8_00.d.d = (Data *)&local_f0;
    args_8_00.d.ptr._1_7_ = 0;
    args_8_00.d.size._0_2_ = (undefined2)args_8.d.size;
    args_8_00.d.size._2_6_ = 0;
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::KeyEvent,QWindow*,unsigned_long,QEvent::Type,int,QFlags<Qt::KeyboardModifier>,unsigned_int,unsigned_int,unsigned_int,QString,bool,unsigned_short>
              (args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8_00,(bool)uVar2,
               (unsigned_short)args_2);
    if (local_f0 != (QArrayData *)0x0) {
      LOCK();
      (local_f0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_f0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_f0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_f0,2,0x10);
      }
    }
    uVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
    goto LAB_0032df2b;
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_80 = (QInputDevice *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = (QWindow *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  piStack_a0 = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = (char16_t *)0x0;
  local_d8.d.size = 0;
  pQVar4 = QInputDevice::primaryKeyboard(&local_d8);
  local_b8._8_4_ = Key;
  local_b8._12_4_ = 0;
  local_b8[0x10] = true;
  if (args == (QWindow *)0x0) {
    local_b8._8_4_ = Key;
    local_b8._12_4_ = 2;
    piStack_a0 = (int *)0x0;
  }
  else {
    piStack_a0 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&args->super_QObject);
  }
  local_88 = (undefined1 *)
             CONCAT44(local_88._4_4_,
                      args_4.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                      super_QFlagsStorage<Qt::KeyboardModifier>.i);
  local_b8._0_8_ = &PTR__KeyEvent_007d8f28;
  local_78 = (undefined1 *)0x0;
  puStack_70 = (undefined1 *)CONCAT44(puStack_70._4_4_,args_3);
  local_68 = *(QArrayData **)&(args_8.d.d)->super_QArrayData;
  puStack_60 = (undefined1 *)((args_8.d.d)->super_QArrayData).alloc;
  local_58._0_4_ = args_8.d.d[1].super_QArrayData.ref_;
  local_58._4_4_ = args_8.d.d[1].super_QArrayData.flags;
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  uStack_50 = (undefined1 *)CONCAT71(uStack_50._1_7_,args_8.d.ptr._0_1_);
  uStack_50 = (undefined1 *)
              CONCAT44(args_2,CONCAT22((undefined2)args_8.d.size,(undefined2)uStack_50));
  local_48 = (undefined1 *)CONCAT44(args_6,args_5);
  puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,args_7);
  local_98 = args;
  puStack_90 = (undefined1 *)args_1;
  pQStack_80 = pQVar4;
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent((WindowSystemEvent *)local_b8);
LAB_0032dec9:
    uVar2 = local_b8[0x10];
  }
  else {
    iVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,local_b8);
    if ((char)iVar3 != '\0') goto LAB_0032dec9;
    uVar2 = 0;
  }
  local_b8._0_8_ = &PTR__KeyEvent_007d8f28;
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,0x10);
    }
  }
  local_b8._0_8_ = &PTR__UserEvent_007d41f0;
  if (piStack_a0 != (int *)0x0) {
    LOCK();
    *piStack_a0 = *piStack_a0 + -1;
    UNLOCK();
    if (*piStack_a0 == 0) {
      piVar5 = piStack_a0;
      if (piStack_a0 == (int *)0x0) {
        piVar5 = (int *)0x0;
      }
      operator_delete(piVar5);
    }
  }
LAB_0032df2b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}